

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglintegration.cpp
# Opt level: O2

QPlatformOpenGLContext * __thiscall
QXcbEglIntegration::createPlatformOpenGLContext(QXcbEglIntegration *this,QOpenGLContext *context)

{
  QPlatformOpenGLContext *this_00;
  QPlatformOpenGLContext *share;
  long in_FS_OFFSET;
  QSurfaceFormat aQStack_48 [8];
  QSurfaceFormat local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::screen();
  QScreen::handle();
  this_00 = (QPlatformOpenGLContext *)operator_new(0x78);
  QOpenGLContext::format();
  QXcbScreen::surfaceFormatFor(local_40);
  share = (QPlatformOpenGLContext *)QOpenGLContext::shareHandle();
  QXcbEglContext::QXcbEglContext((QXcbEglContext *)this_00,local_40,share,this->m_egl_display);
  QSurfaceFormat::~QSurfaceFormat(local_40);
  QSurfaceFormat::~QSurfaceFormat(aQStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformOpenGLContext *QXcbEglIntegration::createPlatformOpenGLContext(QOpenGLContext *context) const
{
    QXcbScreen *screen = static_cast<QXcbScreen *>(context->screen()->handle());
    QXcbEglContext *platformContext = new QXcbEglContext(screen->surfaceFormatFor(context->format()),
                                                         context->shareHandle(),
                                                         eglDisplay());
    return platformContext;
}